

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O1

void __thiscall
vkt::texture::SampleVerifier::getFilteredSample
          (SampleVerifier *this,IVec3 *texelBase,Vec3 *weights,int layer,int level,Vec4 *resultMin,
          Vec4 *resultMax)

{
  ImgDim IVar1;
  Vec2 local_8;
  
  IVar1 = this->m_imParams->dim;
  if ((IVar1 == IMG_DIM_CUBE) || (IVar1 == IMG_DIM_2D)) {
    local_8.m_data = *(float (*) [2])weights->m_data;
    getFilteredSample2D(this,texelBase,&local_8,layer,level,resultMin,resultMax);
  }
  else {
    if (IVar1 == IMG_DIM_1D) {
      getFilteredSample1D(this,texelBase,weights->m_data[0],layer,level,resultMin,resultMax);
      return;
    }
    getFilteredSample3D(this,texelBase,weights,layer,level,resultMin,resultMax);
  }
  return;
}

Assistant:

void SampleVerifier::getFilteredSample (const IVec3&	texelBase,
										const Vec3&		weights,
										int				layer,
										int				level,
										Vec4&			resultMin,
										Vec4&			resultMax) const
{
	DE_ASSERT(layer < m_imParams.arrayLayers);
	DE_ASSERT(level < m_imParams.levels);

	if (m_imParams.dim == IMG_DIM_1D)
	{
		getFilteredSample1D(texelBase, weights.x(), layer, level, resultMin, resultMax);
	}
	else if (m_imParams.dim == IMG_DIM_2D || m_imParams.dim == IMG_DIM_CUBE)
	{
		getFilteredSample2D(texelBase, weights.swizzle(0, 1), layer, level, resultMin, resultMax);
	}
	else
	{
		getFilteredSample3D(texelBase, weights, layer, level, resultMin, resultMax);
	}
}